

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O0

bool __thiscall
OSSLECDSA::reconstructKeyPair
          (OSSLECDSA *this,AsymmetricKeyPair **ppKeyPair,ByteString *serialisedData)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  long *plVar4;
  long *plVar5;
  undefined8 *in_RSI;
  bool rv;
  OSSLECKeyPair *kp;
  ByteString dPriv;
  ByteString dPub;
  OSSLECKeyPair *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 local_70 [40];
  undefined1 local_48 [48];
  undefined8 *local_18;
  byte local_1;
  
  if ((in_RSI == (undefined8 *)0x0) ||
     (local_18 = in_RSI, sVar3 = ByteString::size((ByteString *)0x12c2f7), sVar3 == 0)) {
    local_1 = 0;
  }
  else {
    ByteString::chainDeserialise
              ((ByteString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    ByteString::chainDeserialise
              ((ByteString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    plVar4 = (long *)operator_new(200);
    plVar4[0x16] = 0;
    plVar4[0x17] = 0;
    plVar4[0x14] = 0;
    plVar4[0x15] = 0;
    plVar4[0x12] = 0;
    plVar4[0x13] = 0;
    plVar4[0x10] = 0;
    plVar4[0x11] = 0;
    plVar4[0xe] = 0;
    plVar4[0xf] = 0;
    plVar4[0xc] = 0;
    plVar4[0xd] = 0;
    plVar4[10] = 0;
    plVar4[0xb] = 0;
    plVar4[8] = 0;
    plVar4[9] = 0;
    plVar4[6] = 0;
    plVar4[7] = 0;
    plVar4[4] = 0;
    plVar4[5] = 0;
    plVar4[2] = 0;
    plVar4[3] = 0;
    *plVar4 = 0;
    plVar4[1] = 0;
    plVar4[0x18] = 0;
    OSSLECKeyPair::OSSLECKeyPair(in_stack_ffffffffffffff40);
    plVar5 = (long *)(**(code **)(*plVar4 + 0x18))();
    bVar1 = (**(code **)(*plVar5 + 0x58))(plVar5,local_48);
    plVar5 = (long *)(**(code **)(*plVar4 + 0x28))();
    bVar2 = (**(code **)(*plVar5 + 0x68))(plVar5,local_70);
    if ((bVar2 & 1) == 0 || (bVar1 & 1) == 0) {
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x10))();
      }
      local_1 = 0;
    }
    else {
      *local_18 = plVar4;
      local_1 = 1;
    }
    ByteString::~ByteString((ByteString *)0x12c4cd);
    ByteString::~ByteString((ByteString *)0x12c4da);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLECDSA::reconstructKeyPair(AsymmetricKeyPair** ppKeyPair, ByteString& serialisedData)
{
	// Check input
	if ((ppKeyPair == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	ByteString dPub = ByteString::chainDeserialise(serialisedData);
	ByteString dPriv = ByteString::chainDeserialise(serialisedData);

	OSSLECKeyPair* kp = new OSSLECKeyPair();

	bool rv = true;

	if (!((ECPublicKey*) kp->getPublicKey())->deserialise(dPub))
	{
		rv = false;
	}

	if (!((ECPrivateKey*) kp->getPrivateKey())->deserialise(dPriv))
	{
		rv = false;
	}

	if (!rv)
	{
		delete kp;

		return false;
	}

	*ppKeyPair = kp;

	return true;
}